

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O2

int opn2_openFile(OPN2_MIDIPlayer *device,char *filePath)

{
  OPNMIDIplay *this;
  allocator local_31;
  string local_30;
  
  if (device == (OPN2_MIDIPlayer *)0x0) {
    std::__cxx11::string::assign((char *)&OPN2MIDI_ErrorString_abi_cxx11_);
  }
  else {
    this = (OPNMIDIplay *)device->opn2_midiPlayer;
    if (this == (OPNMIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x20f,"int opn2_openFile(OPN2_MIDIPlayer *, const char *)");
    }
    std::__cxx11::string::string
              ((string *)&local_30,
               "OPNMIDI: MIDI Sequencer is not supported in this build of library!",&local_31);
    OPNMIDIplay::setErrorString(this,&local_30);
    std::__cxx11::string::_M_dispose();
  }
  return -1;
}

Assistant:

OPNMIDI_EXPORT int opn2_openFile(OPN2_MIDIPlayer *device, const char *filePath)
{
    if(device)
    {
        MidiPlayer *play = GET_MIDI_PLAYER(device);
        assert(play);
#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
        play->m_setup.tick_skip_samples_delay = 0;
        if(!play->LoadMIDI(filePath))
        {
            std::string err = play->getErrorString();
            if(err.empty())
                play->setErrorString("OPN2 MIDI: Can't load file");
            return -1;
        }
        else return 0;
#else
        ADL_UNUSED(filePath);
        play->setErrorString("OPNMIDI: MIDI Sequencer is not supported in this build of library!");
        return -1;
#endif
    }

    OPN2MIDI_ErrorString = "Can't load file: OPN2 MIDI is not initialized";
    return -1;
}